

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::SwapRows(Matrix *this,int first_row,int second_row)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int local_28;
  int column;
  bool result;
  int second_row_local;
  int first_row_local;
  Matrix *this_local;
  
  if (first_row == second_row) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = false;
    for (local_28 = 0; local_28 < this->m_; local_28 = local_28 + 1) {
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)first_row);
      pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_28);
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)second_row);
      pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_28);
      bVar1 = operator!=(pvVar3,pvVar4);
      if (bVar1) {
        this_local._7_1_ = true;
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)first_row);
        pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_28)
        ;
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)second_row);
        pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_28)
        ;
        std::swap<Fraction>(pvVar3,pvVar4);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Matrix::SwapRows(int first_row, int second_row) {
  if (first_row == second_row) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[first_row][column] != elements_[second_row][column]) {
      result = true;
      std::swap(elements_[first_row][column], elements_[second_row][column]);
    }
  }

  return result;
}